

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__filename;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long *plVar7;
  FILE *__stream;
  FILE *pFVar8;
  size_t sVar9;
  FILE *pFVar10;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  char *__s;
  char *pcVar14;
  long lVar15;
  int EOP;
  int top_count;
  int bottom_count;
  int blob_index;
  int blob_count;
  int typeindex;
  int layer_count;
  int magic;
  string parambinpath;
  int id;
  int v;
  string include_guard_var;
  string param_var;
  char layer_type [33];
  char layer_name [257];
  char bottom_name [257];
  int local_350;
  int local_34c;
  int local_348;
  uint local_344;
  int local_340;
  int local_33c;
  FILE *local_338;
  int local_32c;
  int local_328 [2];
  char *local_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  char *local_2d8;
  FILE *local_2d0;
  long local_2c8;
  undefined1 local_2bc [4];
  string local_2b8;
  string local_298;
  string local_278;
  string local_248 [8];
  string local_138 [8];
  
  if (argc == 5) {
    pcVar14 = argv[1];
    pcVar1 = argv[2];
    __filename = argv[3];
    local_320 = argv[4];
    pcVar6 = strrchr(pcVar14,0x2f);
    __s = pcVar6 + 1;
    if (pcVar6 == (char *)0x0) {
      __s = pcVar14;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_248,__s,(allocator<char> *)local_138);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_248);
    local_318 = &local_308;
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_308 = *plVar11;
      lStack_300 = plVar7[3];
    }
    else {
      local_308 = *plVar11;
      local_318 = (long *)*plVar7;
    }
    local_310 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_2d8 = pcVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
      operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
    }
    plVar7 = local_318;
    __stream = fopen(pcVar14,"rb");
    pFVar8 = fopen((char *)plVar7,"wb");
    local_338 = fopen(__filename,"wb");
    path_to_varname_abi_cxx11_(&local_298,pcVar14);
    path_to_varname_abi_cxx11_(&local_2b8,__filename);
    pFVar10 = local_338;
    fprintf(local_338,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
    fprintf(pFVar10,"#define NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
    fprintf(pFVar10,"namespace %s_id {\n",local_298._M_dataplus._M_p);
    local_328[1] = 0;
    __isoc99_fscanf(__stream,"%d");
    fwrite(local_328 + 1,4,1,pFVar8);
    local_328[0] = 0;
    local_33c = 0;
    __isoc99_fscanf(__stream,"%d %d");
    fwrite(local_328,4,1,pFVar8);
    fwrite(&local_33c,4,1,pFVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&layer_names_abi_cxx11_,(long)local_328[0]);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&blob_names_abi_cxx11_,(long)local_33c);
    local_340 = 0;
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
      local_344 = 0;
      local_2d0 = pFVar8;
      do {
        local_348 = 0;
        local_34c = 0;
        iVar3 = __isoc99_fscanf(__stream,"%32s %256s %d %d",&local_278,local_248,&local_348,
                                &local_34c);
        if (iVar3 == 4) {
          sanitize_name((char *)local_248);
          local_32c = ncnn::layer_to_index((char *)&local_278);
          fwrite(&local_32c,4,1,pFVar8);
          fwrite(&local_348,4,1,pFVar8);
          fwrite(&local_34c,4,1,pFVar8);
          fprintf(local_338,"const int LAYER_%s = %d;\n",local_248,(ulong)local_344);
          if (0 < local_348) {
            iVar3 = 0;
            do {
              iVar4 = __isoc99_fscanf(__stream,"%256s",local_138);
              if (iVar4 == 1) {
                sanitize_name((char *)local_138);
                if (blob_names_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    blob_names_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  lVar15 = 0;
                  uVar13 = 0;
                  do {
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)((long)&((blob_names_abi_cxx11_.
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar15));
                    if (iVar4 == 0) goto LAB_00107af9;
                    uVar13 = uVar13 + 1;
                    lVar15 = lVar15 + 0x20;
                  } while (uVar13 < (ulong)((long)blob_names_abi_cxx11_.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)blob_names_abi_cxx11_.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                fprintf(_stderr,"find_blob_index_by_name %s failed\n",local_138);
                uVar13 = 0xffffffff;
LAB_00107af9:
                pFVar8 = local_2d0;
                local_2f8[0] = (long *)CONCAT44(local_2f8[0]._4_4_,(int)uVar13);
                fwrite(local_2f8,4,1,local_2d0);
              }
              iVar3 = iVar3 + 1;
            } while (iVar3 < local_348);
          }
          if (0 < local_34c) {
            iVar3 = 0;
            do {
              iVar4 = __isoc99_fscanf(__stream,"%256s",local_138);
              if (iVar4 == 1) {
                sanitize_name((char *)local_138);
                local_2f8[0] = local_2e8;
                sVar9 = strlen((char *)local_138);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2f8,local_138,
                           (long)&local_138[0]._M_dataplus._M_p + sVar9);
                local_2c8 = (long)local_340;
                std::__cxx11::string::operator=
                          ((string *)
                           (blob_names_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_2c8),
                           (string *)local_2f8);
                if (local_2f8[0] != local_2e8) {
                  operator_delete(local_2f8[0],local_2e8[0] + 1);
                }
                fprintf(local_338,"const int BLOB_%s = %d;\n",local_138,local_2c8);
                fwrite(&local_340,4,1,pFVar8);
                local_340 = local_340 + 1;
              }
              iVar3 = iVar3 + 1;
            } while (iVar3 < local_34c);
          }
          local_2f8[0] = (long *)((ulong)local_2f8[0] & 0xffffffff00000000);
          while (iVar3 = __isoc99_fscanf(__stream,"%d=",local_2f8), iVar3 == 1) {
            fwrite(local_2f8,4,1,pFVar8);
            if ((int)local_2f8[0] < -0x5b03) {
              local_350 = 0;
              __isoc99_fscanf(__stream,"%d",&local_350);
              fwrite(&local_350,4,1,pFVar8);
              if (0 < local_350) {
                iVar3 = 0;
                do {
                  __isoc99_fscanf(__stream,",%15[^,\n ]",local_138);
                  bVar2 = vstr_is_float((char *)local_138);
                  if (bVar2) {
                    pcVar14 = "%f";
                  }
                  else {
                    pcVar14 = "%d";
                  }
                  __isoc99_sscanf(local_138,pcVar14,local_2bc);
                  fwrite(local_2bc,4,1,pFVar8);
                  iVar3 = iVar3 + 1;
                } while (iVar3 < local_350);
              }
            }
            else {
              __isoc99_fscanf(__stream,"%15s",local_138);
              bVar2 = vstr_is_float((char *)local_138);
              if (bVar2) {
                pcVar14 = "%f";
              }
              else {
                pcVar14 = "%d";
              }
              __isoc99_sscanf(local_138,pcVar14,&local_350);
              fwrite(&local_350,4,1,pFVar8);
            }
          }
          local_350 = -0xe9;
          fwrite(&local_350,4,1,pFVar8);
          local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
          sVar9 = strlen((char *)local_248);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,local_248,(long)&local_248[0]._M_dataplus._M_p + sVar9);
          std::__cxx11::string::operator=
                    ((string *)
                     (layer_names_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)local_344),
                     (string *)local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
            operator_delete(local_138[0]._M_dataplus._M_p,
                            local_138[0].field_2._M_allocated_capacity + 1);
          }
          local_344 = local_344 + 1;
        }
        iVar3 = feof(__stream);
      } while (iVar3 == 0);
    }
    pFVar10 = local_338;
    fprintf(local_338,"} // namespace %s_id\n",local_298._M_dataplus._M_p);
    fprintf(pFVar10,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
    fclose(__stream);
    fclose(pFVar8);
    fclose(pFVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    plVar7 = local_318;
    pFVar10 = fopen(local_320,"wb");
    path_to_varname_abi_cxx11_(local_248,(char *)plVar7);
    path_to_varname_abi_cxx11_(local_138,local_320);
    pFVar8 = fopen((char *)plVar7,"rb");
    fprintf(pFVar10,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fprintf(pFVar10,"#define NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar10);
    fprintf(pFVar10,"static const unsigned char %s[] = {\n",local_248[0]._M_dataplus._M_p);
    iVar3 = feof(pFVar8);
    if (iVar3 == 0) {
      uVar12 = 1;
      do {
        uVar5 = fgetc(pFVar8);
        if (uVar5 == 0xffffffff) break;
        fprintf(pFVar10,"0x%02x,",(ulong)uVar5);
        if ((uVar12 & 0xf) == 0) {
          fputc(10,pFVar10);
        }
        iVar3 = feof(pFVar8);
        uVar12 = uVar12 + 1;
      } while (iVar3 == 0);
    }
    fwrite("};\n",3,1,pFVar10);
    fclose(pFVar8);
    pcVar14 = local_2d8;
    path_to_varname_abi_cxx11_(&local_278,local_2d8);
    pFVar8 = fopen(pcVar14,"rb");
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar10);
    fprintf(pFVar10,"static const unsigned char %s[] = {\n",local_278._M_dataplus._M_p);
    iVar3 = feof(pFVar8);
    if (iVar3 == 0) {
      uVar12 = 1;
      do {
        uVar5 = fgetc(pFVar8);
        if (uVar5 == 0xffffffff) break;
        fprintf(pFVar10,"0x%02x,",(ulong)uVar5);
        if ((uVar12 & 0xf) == 0) {
          fputc(10,pFVar10);
        }
        iVar3 = feof(pFVar8);
        uVar12 = uVar12 + 1;
      } while (iVar3 == 0);
    }
    fwrite("};\n",3,1,pFVar10);
    fprintf(pFVar10,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fclose(pFVar8);
    fclose(pFVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
      operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
      operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    iVar3 = 0;
  }
  else {
    main_cold_1();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 5)
    {
        fprintf(stderr, "Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n", argv[0]);
        return -1;
    }

    const char* parampath = argv[1];
    const char* modelpath = argv[2];
    const char* idcpppath = argv[3];
    const char* memcpppath = argv[4];

    const char* lastslash = strrchr(parampath, '/');
    const char* name = lastslash == NULL ? parampath : lastslash + 1;

    std::string parambinpath = std::string(name) + ".bin";

    dump_param(parampath, parambinpath.c_str(), idcpppath);

    write_memcpp(parambinpath.c_str(), modelpath, memcpppath);

    return 0;
}